

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cc
# Opt level: O3

void __thiscall GraphViz::AddTarget(GraphViz *this,Node *node)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Node *node_00;
  pointer ppNVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  pointer ppNVar6;
  _Base_ptr p_Var7;
  long lVar8;
  char *pcVar9;
  pointer ppNVar10;
  pointer ppNVar11;
  Edge *edge;
  string pathstr;
  string err;
  Edge *local_80;
  Node *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  p_Var5 = (this->visited_nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->visited_nodes_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(Node **)(p_Var5 + 1) >= node) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(Node **)(p_Var5 + 1) < node];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(Node **)(p_Var7 + 1) <= node)) {
      return;
    }
  }
  local_70 = local_60;
  pcVar2 = (node->path_)._M_dataplus._M_p;
  local_78 = node;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (node->path_)._M_string_length);
  if (local_68 != 0) {
    lVar8 = 0;
    do {
      if (*(char *)((long)local_70 + lVar8) == '\\') {
        *(undefined1 *)((long)local_70 + lVar8) = 0x2f;
      }
      lVar8 = lVar8 + 1;
    } while (local_68 != lVar8);
  }
  printf("\"%p\" [label=\"%s\"]\n",local_78,local_70);
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->visited_nodes_,&local_78);
  local_80 = local_78->in_edge_;
  if (local_80 != (Edge *)0x0) {
    p_Var5 = (this->visited_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var1 = &(this->visited_edges_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(Edge **)(p_Var5 + 1) >= local_80) {
          p_Var7 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(Edge **)(p_Var5 + 1) < local_80];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(Edge **)(p_Var7 + 1) <= local_80))
      goto LAB_0011a2d8;
    }
    std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
    _M_insert_unique<Edge*const&>
              ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *
               )&this->visited_edges_,&local_80);
    node_00 = local_80->dyndep_;
    if ((node_00 != (Node *)0x0) && (node_00->dyndep_pending_ == true)) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar4 = DyndepLoader::LoadDyndeps(&this->dyndep_loader_,node_00,&local_50);
      if (!bVar4) {
        Warning("%s\n",local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    ppNVar10 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (((long)(local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)ppNVar10 == 8) &&
       (ppNVar6 = (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       (long)(local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppNVar6 == 8)) {
      printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",*ppNVar10,*ppNVar6,
             (local_80->rule_->name_)._M_dataplus._M_p);
      ppNVar10 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    else {
      printf("\"%p\" [label=\"%s\", shape=ellipse]\n",local_80,
             (local_80->rule_->name_)._M_dataplus._M_p);
      ppNVar10 = (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppNVar10 !=
          (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          printf("\"%p\" -> \"%p\"\n",local_80,*ppNVar10);
          ppNVar10 = ppNVar10 + 1;
        } while (ppNVar10 !=
                 (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      ppNVar10 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar6 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppNVar11 = ppNVar10;
      if (ppNVar10 != ppNVar6) {
        do {
          ppNVar3 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar9 = "";
          if ((ulong)(((long)ppNVar6 - (long)ppNVar3 >> 3) - (long)local_80->order_only_deps_) <=
              (ulong)((long)ppNVar11 - (long)ppNVar3 >> 3)) {
            pcVar9 = " style=dotted";
          }
          printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n",*ppNVar10,local_80,pcVar9);
          ppNVar10 = ppNVar10 + 1;
          ppNVar6 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppNVar11 = ppNVar11 + 1;
        } while (ppNVar10 != ppNVar6);
      }
    }
    ppNVar6 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppNVar6 != ppNVar10) {
      do {
        AddTarget(this,*ppNVar6);
        ppNVar6 = ppNVar6 + 1;
      } while (ppNVar6 !=
               (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
LAB_0011a2d8:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void GraphViz::AddTarget(Node* node) {
  if (visited_nodes_.find(node) != visited_nodes_.end())
    return;

  string pathstr = node->path();
  replace(pathstr.begin(), pathstr.end(), '\\', '/');
  printf("\"%p\" [label=\"%s\"]\n", node, pathstr.c_str());
  visited_nodes_.insert(node);

  Edge* edge = node->in_edge();

  if (!edge) {
    // Leaf node.
    // Draw as a rect?
    return;
  }

  if (visited_edges_.find(edge) != visited_edges_.end())
    return;
  visited_edges_.insert(edge);

  if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
    std::string err;
    if (!dyndep_loader_.LoadDyndeps(edge->dyndep_, &err)) {
      Warning("%s\n", err.c_str());
    }
  }

  if (edge->inputs_.size() == 1 && edge->outputs_.size() == 1) {
    // Can draw simply.
    // Note extra space before label text -- this is cosmetic and feels
    // like a graphviz bug.
    printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",
           edge->inputs_[0], edge->outputs_[0], edge->rule_->name().c_str());
  } else {
    printf("\"%p\" [label=\"%s\", shape=ellipse]\n",
           edge, edge->rule_->name().c_str());
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      printf("\"%p\" -> \"%p\"\n", edge, *out);
    }
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in) {
      const char* order_only = "";
      if (edge->is_order_only(in - edge->inputs_.begin()))
        order_only = " style=dotted";
      printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n", (*in), edge, order_only);
    }
  }

  for (vector<Node*>::iterator in = edge->inputs_.begin();
       in != edge->inputs_.end(); ++in) {
    AddTarget(*in);
  }
}